

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void jmp_far(PDISASM pMyDisasm)

{
  OPTYPE *pOVar1;
  REGISTERTYPE *pRVar2;
  Int64 *pIVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  UIntPtr UVar7;
  uint uVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  UInt8 UVar13;
  UInt8 UVar14;
  UInt8 UVar15;
  size_t sVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10006;
    (pMyDisasm->Instruction).BranchType = 0xb;
    pOVar1 = &pMyDisasm->Operand1;
    (pMyDisasm->Operand1).AccessMode = 1;
    pcVar17 = (pMyDisasm->Instruction).Mnemonic;
    bVar20 = (pMyDisasm->Reserved_).SYNTAX_ != 0x400;
    if (bVar20) {
      builtin_strncpy(pcVar17,"jmp far",8);
    }
    else {
      builtin_strncpy(pcVar17,"ljmp",5);
      pOVar1->OpMnemonic[0] = '$';
      pOVar1->OpMnemonic[1] = '\0';
    }
    uVar19 = (ulong)!bVar20;
    uVar6 = (pMyDisasm->Reserved_).EndOfBlock;
    UVar7 = (pMyDisasm->Reserved_).EIP_;
    if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      bVar20 = uVar6 < UVar7 + 7 && uVar6 != 0;
      lVar18 = 5;
    }
    else {
      bVar20 = uVar6 < UVar7 + 5 && uVar6 != 0;
      lVar18 = 3;
    }
    if (bVar20) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
    else {
      uVar4 = *(ushort *)(UVar7 + lVar18);
      sVar16 = CopyFormattedNumber(pMyDisasm,pOVar1->OpMnemonic + uVar19,"%.4X",(ulong)uVar4);
      pcVar17 = pOVar1->OpMnemonic + sVar16 + uVar19;
      if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
        builtin_strncpy(pOVar1->OpMnemonic + sVar16 + uVar19," , $",5);
        lVar18 = 4;
      }
      else {
        pcVar17[2] = '\0';
        pcVar17[0] = ' ';
        pcVar17[1] = ':';
        lVar18 = 3;
      }
      uVar5 = *(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
      uVar8 = uVar5 & 0xffff;
      if ((pMyDisasm->Reserved_).OperandSize != 0x10) {
        uVar8 = uVar5;
      }
      CopyFormattedNumber(pMyDisasm,pcVar17 + lVar18,"%.8X",(ulong)uVar8);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).OperandSize == 0x20) * 2 + 5
      ;
      (pMyDisasm->Instruction).AddrValue = (ulong)uVar4 * 0x10 + (ulong)uVar8;
      pRVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar2->type = (byte)pRVar2->type | 0x20;
      pIVar3 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar3 = (byte)*pIVar3 | 1;
      UVar9 = EFLAGS_TABLE[0x33].SF_;
      UVar10 = EFLAGS_TABLE[0x33].ZF_;
      UVar11 = EFLAGS_TABLE[0x33].AF_;
      UVar12 = EFLAGS_TABLE[0x33].PF_;
      UVar13 = EFLAGS_TABLE[0x33].CF_;
      UVar14 = EFLAGS_TABLE[0x33].TF_;
      UVar15 = EFLAGS_TABLE[0x33].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x33].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar9;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar10;
      (pMyDisasm->Instruction).Flags.AF_ = UVar11;
      (pMyDisasm->Instruction).Flags.PF_ = UVar12;
      (pMyDisasm->Instruction).Flags.CF_ = UVar13;
      (pMyDisasm->Instruction).Flags.TF_ = UVar14;
      (pMyDisasm->Instruction).Flags.IF_ = UVar15;
      UVar9 = EFLAGS_TABLE[0x33].NT_;
      UVar10 = EFLAGS_TABLE[0x33].RF_;
      UVar11 = EFLAGS_TABLE[0x33].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x33].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar9;
      (pMyDisasm->Instruction).Flags.RF_ = UVar10;
      (pMyDisasm->Instruction).Flags.alignment = UVar11;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ jmp_far(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    UInt64 MyAddress;
    size_t i = 0;
    if (GV.Architecture == 64) {
        failDecode(pMyDisasm);
    }
    else {
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
        pMyDisasm->Instruction.BranchType = JmpType;
        pMyDisasm->Operand1.AccessMode = READ;
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ljmp");
            #endif
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic,"\x24");
            #endif
            i++;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "jmp far");
            #endif
        }
        if (GV.OperandSize ==32) {
            if (!Security(7, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+5));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        else {
            if (!Security(5, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+3));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " , \x24");
            #endif
            i+=4;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " :");
            #endif
            i+=3;
        }
        MyAddress = MyNumber*16;
        MyNumber = *((UInt32*) (GV.EIP_+1));
        if (GV.OperandSize == 16) {
            MyNumber = MyNumber & 0xffff;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.8X",(Int64) MyNumber);
        #endif
        if (GV.OperandSize == 32) {
            GV.EIP_+=7;
        }
        else {
            GV.EIP_+=5;
        }
        pMyDisasm->Instruction.AddrValue = MyAddress + MyNumber;
        FillFlags(pMyDisasm,51);
    }
}